

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O0

void hmac_blake224_init(hmac_state *S,uint8_t *_key,uint64_t keylen)

{
  state_conflict *in_RDX;
  uint8_t *in_RSI;
  state_conflict *in_RDI;
  uint64_t i;
  uint8_t pad [64];
  uint8_t keyhash [32];
  uint8_t *key;
  uint8_t *in_stack_ffffffffffffff68;
  state_conflict *psVar1;
  byte local_88 [64];
  uint8_t local_48 [40];
  
  if ((state_conflict *)0x40 < in_RDX) {
    blake256_hash(in_RSI,(uint8_t *)in_RDX,(uint64_t)in_RSI);
    in_RSI = local_48;
    in_RDX = (state_conflict *)0x1c;
  }
  blake224_init(in_RDI);
  memset(local_88,0x36,0x40);
  for (psVar1 = (state_conflict *)0x0; psVar1 < in_RDX;
      psVar1 = (state_conflict *)((long)psVar1->h + 1)) {
    local_88[(long)psVar1] = local_88[(long)psVar1] ^ in_RSI[(long)psVar1];
  }
  blake224_update(psVar1,in_stack_ffffffffffffff68,0x247b32);
  blake224_init(in_RDI + 1);
  memset(local_88,0x5c,0x40);
  for (psVar1 = (state_conflict *)0x0; psVar1 < in_RDX;
      psVar1 = (state_conflict *)((long)psVar1->h + 1)) {
    local_88[(long)psVar1] = local_88[(long)psVar1] ^ in_RSI[(long)psVar1];
  }
  blake224_update(psVar1,in_stack_ffffffffffffff68,0x247bbe);
  memset(local_48,0,0x20);
  return;
}

Assistant:

void hmac_blake224_init(hmac_state *S, const uint8_t *_key, uint64_t keylen) {
    const uint8_t *key = _key;
    uint8_t keyhash[32];
    uint8_t pad[64];
    uint64_t i;

    if (keylen > 64) {
        blake256_hash(keyhash, key, keylen);
        key = keyhash;
        keylen = 28;
    }

    blake224_init(&S->inner);
    memset(pad, 0x36, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->inner, pad, 512);

    blake224_init(&S->outer);
    memset(pad, 0x5c, 64);
    for (i = 0; i < keylen; ++i) {
        pad[i] ^= key[i];
    }
    blake224_update(&S->outer, pad, 512);

    memset(keyhash, 0, 32);
}